

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

void __thiscall
SList<BlockRecord,_Memory::ArenaAllocator,_RealCount>::~SList
          (SList<BlockRecord,_Memory::ArenaAllocator,_RealCount> *this)

{
  SList<BlockRecord,_Memory::ArenaAllocator,_RealCount> *this_local;
  
  Clear(this);
  SListBase<BlockRecord,_Memory::ArenaAllocator,_RealCount>::~SListBase
            (&this->super_SListBase<BlockRecord,_Memory::ArenaAllocator,_RealCount>);
  return;
}

Assistant:

~SList()
    {
        Clear();
    }